

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_atomic_ptr_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRType *expr_type;
  string local_38;
  
  to_non_uniform_aware_expression_abi_cxx11_(__return_storage_ptr__,this,id);
  bVar1 = should_dereference(this,id);
  if (bVar1) {
    expr_type = Compiler::expression_type(&this->super_Compiler,id);
    dereference_expression(&local_38,this,expr_type,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_atomic_ptr_expression(uint32_t id)
{
	string expr = to_non_uniform_aware_expression(id);
	// If we have naked pointer to POD, we need to dereference to get the proper ".value" resolve.
	if (should_dereference(id))
		expr = dereference_expression(expression_type(id), expr);
	return expr;
}